

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O1

bool comparesEqual(QJsonValue *lhs,QJsonValue *rhs)

{
  Type type;
  Type type_00;
  bool bVar1;
  Type TVar2;
  long in_FS_OFFSET;
  double dVar3;
  double dVar4;
  QStringView rhs_00;
  QStringView lhs_00;
  QString local_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  type = (lhs->value).t;
  type_00 = (rhs->value).t;
  if (type == type_00) {
    bVar1 = false;
    if (type < Map) {
      if (type == Integer) {
        bVar1 = (lhs->value).n == (rhs->value).n;
      }
      else if (type == String) {
        QJsonValue::toString(&local_48,lhs);
        QJsonValue::toString(&local_60,rhs);
        if (local_48.d.size == local_60.d.size) {
          rhs_00.m_data = local_60.d.ptr;
          rhs_00.m_size = local_60.d.size;
          lhs_00.m_data = local_48.d.ptr;
          lhs_00.m_size = local_48.d.size;
          bVar1 = QtPrivate::equalStrings(lhs_00,rhs_00);
        }
        else {
          bVar1 = false;
        }
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else if (type == Array) {
        QJsonValue::toArray((QJsonValue *)&local_48);
        QJsonValue::toArray((QJsonValue *)&local_60);
        bVar1 = comparesEqual((QJsonArray *)&local_48,(QJsonArray *)&local_60);
        QJsonArray::~QJsonArray((QJsonArray *)&local_60);
        QJsonArray::~QJsonArray((QJsonArray *)&local_48);
      }
      goto LAB_002fcd59;
    }
    if ((uint)(type + 0xfffffeec) < 4) {
      bVar1 = true;
      goto LAB_002fcd59;
    }
    if (type == Map) {
      QJsonValue::toObject((QJsonValue *)&local_48);
      QJsonValue::toObject((QJsonValue *)&local_60);
      bVar1 = comparesEqual((QJsonObject *)&local_48,(QJsonObject *)&local_60);
      QJsonObject::~QJsonObject((QJsonObject *)&local_60);
      QJsonObject::~QJsonObject((QJsonObject *)&local_48);
      goto LAB_002fcd59;
    }
    bVar1 = false;
    if (type != Double) goto LAB_002fcd59;
LAB_002fcc8f:
    dVar3 = (double)(lhs->value).n;
  }
  else {
    TVar2 = convertFromCborType(type);
    if ((TVar2 != Double) || (TVar2 = convertFromCborType(type_00), TVar2 != Double)) {
      bVar1 = false;
      goto LAB_002fcd59;
    }
    if (type == Integer) {
      dVar3 = (double)(lhs->value).n;
    }
    else {
      dVar3 = 0.0;
      if (type == Double) goto LAB_002fcc8f;
    }
  }
  if (type_00 == Integer) {
    dVar4 = (double)(rhs->value).n;
  }
  else {
    dVar4 = 0.0;
    if (type_00 == Double) {
      dVar4 = (double)(rhs->value).n;
    }
  }
  bVar1 = (bool)(-(dVar3 == dVar4) & 1);
LAB_002fcd59:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool comparesEqual(const QJsonValue &lhs, const QJsonValue &rhs)
{
    if (lhs.value.type() != rhs.value.type()) {
        if (lhs.isDouble() && rhs.isDouble()) {
            // One value Cbor integer, one Cbor double, should interact as doubles.
            return lhs.toDouble() == rhs.toDouble();
        }
        return false;
    }

    switch (lhs.value.type()) {
    case QCborValue::Undefined:
    case QCborValue::Null:
    case QCborValue::True:
    case QCborValue::False:
        break;
    case QCborValue::Double:
        return lhs.toDouble() == rhs.toDouble();
    case QCborValue::Integer:
        return QJsonPrivate::Value::valueHelper(lhs.value)
                == QJsonPrivate::Value::valueHelper(rhs.value);
    case QCborValue::String:
        return lhs.toString() == rhs.toString();
    case QCborValue::Array:
        return lhs.toArray() == rhs.toArray();
    case QCborValue::Map:
        return lhs.toObject() == rhs.toObject();
    default:
        return false;
    }
    return true;
}